

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *ppdVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  size_t sVar3;
  FindInfo FVar4;
  Layout LVar5;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    ppdVar1 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar3 = 0;
      do {
        if (-1 < p[sVar3]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = ppdVar1[sVar3];
          hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                    SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
          FVar4 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar4.offset,(byte)hashval & 0x7f);
          this->slots_[FVar4.offset] = ppdVar1[sVar3];
        }
        sVar3 = sVar3 + 1;
      } while (capacity != sVar3);
      LVar5 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<cov::dll*>>
                ((allocator<cov::dll_*> *)&this->settings_,p,
                 (LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_cov::dll_*>.size_[0] + 7 &
                 0xfffffffffffffff8) +
                 LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_cov::dll_*>.size_[1] * 8);
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll *>, phmap::priv::HashEq<cov::dll *>::Hash, phmap::priv::HashEq<cov::dll *>::Eq, std::allocator<cov::dll *>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<cov::dll *>, Hash = phmap::priv::HashEq<cov::dll *>::Hash, Eq = phmap::priv::HashEq<cov::dll *>::Eq, Alloc = std::allocator<cov::dll *>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n)
		{
			return ((n + 1) & n) == 0 && n > 0;
		}